

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_callback_finalize_nolock_
               (event_base *base,uint flags,event_callback *evcb,
               _func_void_event_callback_ptr_void_ptr *cb)

{
  if ((evcb->evcb_flags & 0x80) == 0) {
    event_callback_cancel_nolock_(base,evcb,0);
  }
  else {
    event_del_nolock_((event *)evcb,0);
  }
  evcb->evcb_closure = '\x04';
  (evcb->evcb_cb_union).evcb_selfcb = cb;
  event_callback_activate_nolock_(base,evcb);
  *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags | 0x40;
  return;
}

Assistant:

void
event_callback_finalize_nolock_(struct event_base *base, unsigned flags, struct event_callback *evcb, void (*cb)(struct event_callback *, void *))
{
	struct event *ev = NULL;
	if (evcb->evcb_flags & EVLIST_INIT) {
		ev = event_callback_to_event(evcb);
		event_del_nolock_(ev, EVENT_DEL_NOBLOCK);
	} else {
		event_callback_cancel_nolock_(base, evcb, 0); /*XXX can this fail?*/
	}

	evcb->evcb_closure = EV_CLOSURE_CB_FINALIZE;
	evcb->evcb_cb_union.evcb_cbfinalize = cb;
	event_callback_activate_nolock_(base, evcb); /* XXX can this really fail?*/
	evcb->evcb_flags |= EVLIST_FINALIZING;
}